

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int *piVar1;
  istream *this;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  int m;
  int n;
  int b;
  int a;
  vector<int> v;
  vector<std::pair<int,_int>_> data;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  vector<int> local_70;
  vector<std::pair<int,_int>_> local_58;
  vector<std::pair<int,_int>_> local_40;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105160) = 0;
  local_70.mData = (int *)operator_new__(4);
  *local_70.mData = 0;
  local_70.mCap = 1;
  local_70.mSize = 0;
  local_58.mData = (pair<int,_int> *)operator_new__(8);
  (local_58.mData)->first = 0;
  (local_58.mData)->second = 0;
  local_58.mCap = 1;
  local_58.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_7c);
  CP::vector<int>::resize(&local_70,(long)local_7c);
  if (0 < local_7c) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,(int *)((long)local_70.mData + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar4 < local_7c);
  }
  std::istream::operator>>((istream *)&std::cin,&local_80);
  CP::vector<std::pair<int,_int>_>::resize(&local_58,(long)local_80);
  if (0 < local_80) {
    lVar3 = 0;
    do {
      this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_74);
      std::istream::operator>>(this,&local_78);
      local_58.mData[lVar3].first = local_74;
      local_58.mData[lVar3].second = local_78;
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_80);
  }
  CP::vector<std::pair<int,_int>_>::vector(&local_40,&local_58);
  CP::vector<int>::insert_many(&local_70,&local_40);
  if (local_40.mData != (pair<int,_int> *)0x0) {
    operator_delete__(local_40.mData);
  }
  piVar1 = local_70.mData;
  if (local_70.mSize != 0) {
    lVar4 = local_70.mSize << 2;
    lVar3 = 0;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)piVar1 + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar3 = lVar3 + 4;
    } while (lVar4 != lVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  if (local_58.mData != (pair<int,_int> *)0x0) {
    operator_delete__(local_58.mData);
  }
  if (local_70.mData != (int *)0x0) {
    operator_delete__(local_70.mData);
  }
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  int n,m;
  CP::vector<int> v;
  CP::vector<std::pair<int,int>> data;
  std::cin >> n;
  v.resize(n);
  for (int i = 0;i < n;i++)  {
    std::cin >> v[i];
  }
  std::cin >> m;
  data.resize(m);
  for (int i = 0;i < m;i++) {
    int a,b;
    std::cin >> a >> b;
    data[i] = {a,b};
  }


  v.insert_many(data);
  for (auto &x : v) {
    std::cout << x << " ";
  }
  std::cout << std::endl;

}